

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void setGlfwFlags(void)

{
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  glfwWindowHint(unaff_retaddr_00,unaff_retaddr);
  glfwWindowHint(unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

void setGlfwFlags()
{
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
#if __APPLE__
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif
}